

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sjio.cpp
# Opt level: O0

void PrepareListLine(char *buffer,aint hexadd)

{
  uint uVar1;
  int iVar2;
  reference pvVar3;
  int local_34;
  uint local_24;
  aint linenumber;
  uint32_t currentLine;
  int linewidth;
  int digit;
  aint hexadd_local;
  char *buffer_local;
  
  iVar2 = reglenwidth;
  currentLine = 0x20;
  linenumber = reglenwidth;
  pvVar3 = std::vector<TextFilePos,_std::allocator<TextFilePos>_>::at
                     (&sourcePosStack,(long)IncludeLevel);
  uVar1 = pvVar3->line;
  local_24 = uVar1 % 10000;
  if (4 < iVar2) {
    linenumber = 5;
    currentLine = uVar1 / 10000 + 0x30;
    if (0x7e < currentLine) {
      currentLine = 0x7e;
    }
    if (9999 < uVar1) {
      local_24 = local_24 + 10000;
    }
  }
  memset(buffer,0x20,0x18);
  if (listmacro != 0) {
    buffer[0x17] = '>';
  }
  if (DAT_001e16a0 == 2) {
    buffer[0x17] = '{';
  }
  snprintf(buffer,0x800,"%*u",(ulong)(uint)linenumber,(ulong)local_24);
  buffer[linenumber] = ' ';
  if (6 - linenumber < IncludeLevel) {
    local_34 = 6 - linenumber;
  }
  else {
    local_34 = IncludeLevel;
  }
  memcpy(buffer + linenumber,"++++++",(long)local_34);
  snprintf(buffer + 6,0x800,"%04X",(ulong)(hexadd & 0xffff));
  buffer[10] = ' ';
  if (0x30 < currentLine) {
    *buffer = (char)currentLine;
  }
  if (*substitutedLine == '\0') {
    substitutedLine = line;
  }
  strcpy(buffer + 0x18,substitutedLine);
  if ((substitutedLine != line) && (eolComment != (char *)0x0)) {
    strncat(buffer,eolComment,0x1000);
  }
  return;
}

Assistant:

void PrepareListLine(char* buffer, aint hexadd)
{
	////////////////////////////////////////////////////
	// Line numbers to 1 to 99999 are supported only  //
	// For more lines, then first char is incremented //
	////////////////////////////////////////////////////

	int digit = ' ';
	int linewidth = reglenwidth;
	uint32_t currentLine = sourcePosStack.at(IncludeLevel).line;
	aint linenumber = currentLine % 10000;
	if (5 <= linewidth) {		// five-digit number, calculate the leading "digit"
		linewidth = 5;
		digit = currentLine / 10000 + '0';
		if (digit > '~') digit = '~';
		if (currentLine >= 10000) linenumber += 10000;
	}
	memset(buffer, ' ', 24);
	if (listmacro) buffer[23] = '>';
	if (Options::LST_T_MC_ONLY == Options::syx.ListingType) buffer[23] = '{';
	SPRINTF2(buffer, LINEMAX, "%*u", linewidth, linenumber); buffer[linewidth] = ' ';
	memcpy(buffer + linewidth, "++++++", IncludeLevel > 6 - linewidth ? 6 - linewidth : IncludeLevel);
	SPRINTF1(buffer + 6, LINEMAX, "%04X", hexadd & 0xFFFF); buffer[10] = ' ';
	if (digit > '0') *buffer = digit & 0xFF;
	// if substitutedLine is completely empty, list rather source line any way
	if (!*substitutedLine) substitutedLine = line;
	STRCPY(buffer + 24, LINEMAX2-24, substitutedLine);
	// add EOL comment if substituted was used and EOL comment is available
	if (substitutedLine != line && eolComment) STRCAT(buffer, LINEMAX2, eolComment);
}